

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<const_unsigned_char_&>::Matcher(Matcher<const_unsigned_char_&> *this,uchar *value)

{
  MatcherBase<const_unsigned_char_&> local_28;
  
  (this->super_MatcherBase<const_unsigned_char_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_unsigned_char_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00163728;
  local_28.buffer_.i._0_1_ = *value;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<unsigned_char_const&>::
       GetVTable<testing::internal::MatcherBase<unsigned_char_const&>::ValuePolicy<testing::internal::EqMatcher<unsigned_char>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00163728;
  internal::MatcherBase<const_unsigned_char_&>::operator=
            (&this->super_MatcherBase<const_unsigned_char_&>,&local_28);
  internal::MatcherBase<const_unsigned_char_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }